

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O0

Gia_Man_t *
Gia_ManCreateUnate(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrame,int nRealPis,int fUseAllObjects)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int Value_2;
  int Value_1;
  int Value;
  int k;
  int f;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fUseAllObjects_local;
  int nRealPis_local;
  int iFrame_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  if ((iFrame < 0) || (pCex->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0xbc,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  p_00 = Gia_ManStart(1000);
  pcVar3 = Abc_UtilStrsav("unate");
  p_00->pName = pcVar3;
  Gia_ManCleanValue(p);
  if (nRealPis < 0) {
    Value_1 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar6 = false;
      if (Value_1 < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pObjRo = Gia_ManCi(p,iVar1 + Value_1);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      if (fUseAllObjects == 0) {
        iVar1 = Gia_ManGetTwo(p,iFrame,pObjRo);
        if (iVar1 >> 1 != 0) {
          uVar2 = Gia_ManAppendCi(p_00);
          pObjRo->Value = uVar2;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_00);
        iVar1 = Gia_ManGetTwo(p,iFrame,pObjRo);
        if (iVar1 >> 1 != 0) {
          pObjRo->Value = uVar2;
        }
      }
      Value_1 = Value_1 + 1;
    }
  }
  else {
    Value_1 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar6 = false;
      if (Value_1 < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pObjRo = Gia_ManCi(p,iVar1 + Value_1);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ManGetTwo(p,iFrame,pObjRo);
      pObjRo->Value = iVar1 >> 1;
      Value_1 = Value_1 + 1;
    }
  }
  Gia_ManHashAlloc(p_00);
  for (Value = iFrame; Value <= pCex->iFrame; Value = Value + 1) {
    pObjRo = Gia_ManConst0(p);
    iVar1 = Gia_ManGetTwo(p,Value,pObjRo);
    pObjRo->Value = iVar1 >> 1;
    if (nRealPis < 0) {
      Value_1 = 0;
      while( true ) {
        iVar1 = Gia_ManPiNum(p);
        bVar6 = false;
        if (Value_1 < iVar1) {
          pObjRo = Gia_ManCi(p,Value_1);
          bVar6 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar1 = Gia_ManGetTwo(p,Value,pObjRo);
        pObjRo->Value = iVar1 >> 1;
        Value_1 = Value_1 + 1;
      }
    }
    else {
      Value_1 = 0;
      while( true ) {
        iVar1 = Gia_ManPiNum(p);
        bVar6 = false;
        if (Value_1 < iVar1) {
          pObjRo = Gia_ManCi(p,Value_1);
          bVar6 = pObjRo != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar1 = Gia_ManGetTwo(p,Value,pObjRo);
        pObjRo->Value = iVar1 >> 1;
        if (nRealPis <= Value_1) {
          if (fUseAllObjects == 0) {
            iVar1 = Gia_ManGetTwo(p,Value,pObjRo);
            if (iVar1 >> 1 != 0) {
              uVar2 = Gia_ManAppendCi(p_00);
              pObjRo->Value = uVar2;
            }
          }
          else {
            uVar2 = Gia_ManAppendCi(p_00);
            iVar1 = Gia_ManGetTwo(p,Value,pObjRo);
            if (iVar1 >> 1 != 0) {
              pObjRo->Value = uVar2;
            }
          }
        }
        Value_1 = Value_1 + 1;
      }
    }
    Value_1 = 0;
    while( true ) {
      bVar6 = false;
      if (Value_1 < p->nObjs) {
        pObjRo = Gia_ManObj(p,Value_1);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjIsAnd(pObjRo);
      if (iVar1 != 0) {
        pObjRo->Value = 0;
        iVar1 = Gia_ManGetTwo(p,Value,pObjRo);
        if (iVar1 >> 1 != 0) {
          pGVar4 = Gia_ObjFanin0(pObjRo);
          if ((pGVar4->Value == 0) || (pGVar4 = Gia_ObjFanin1(pObjRo), pGVar4->Value == 0)) {
            pGVar4 = Gia_ObjFanin0(pObjRo);
            if (pGVar4->Value == 0) {
              pGVar4 = Gia_ObjFanin1(pObjRo);
              if (pGVar4->Value == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                              ,0x11c,
                              "Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)"
                             );
              }
              pGVar4 = Gia_ObjFanin1(pObjRo);
              pObjRo->Value = pGVar4->Value;
            }
            else {
              pGVar4 = Gia_ObjFanin0(pObjRo);
              pObjRo->Value = pGVar4->Value;
            }
          }
          else {
            uVar2 = Gia_ManGetTwo(p,Value,pObjRo);
            if ((uVar2 & 1) == 0) {
              pGVar4 = Gia_ObjFanin0(pObjRo);
              if ((pGVar4->Value < 2) || (pGVar4 = Gia_ObjFanin1(pObjRo), pGVar4->Value < 2)) {
                pGVar4 = Gia_ObjFanin0(pObjRo);
                if (pGVar4->Value < 2) {
                  pGVar4 = Gia_ObjFanin1(pObjRo);
                  if (pGVar4->Value < 2) {
                    pObjRo->Value = 1;
                  }
                  else {
                    pGVar4 = Gia_ObjFanin1(pObjRo);
                    pObjRo->Value = pGVar4->Value;
                  }
                }
                else {
                  pGVar4 = Gia_ObjFanin0(pObjRo);
                  pObjRo->Value = pGVar4->Value;
                }
              }
              else {
                pGVar4 = Gia_ObjFanin0(pObjRo);
                uVar2 = pGVar4->Value;
                pGVar4 = Gia_ObjFanin1(pObjRo);
                uVar2 = Gia_ManHashOr(p_00,uVar2,pGVar4->Value);
                pObjRo->Value = uVar2;
              }
            }
            else {
              pGVar4 = Gia_ObjFanin0(pObjRo);
              if ((pGVar4->Value < 2) || (pGVar4 = Gia_ObjFanin1(pObjRo), pGVar4->Value < 2)) {
                pGVar4 = Gia_ObjFanin0(pObjRo);
                if (pGVar4->Value < 2) {
                  pGVar4 = Gia_ObjFanin1(pObjRo);
                  if (pGVar4->Value < 2) {
                    pObjRo->Value = 1;
                  }
                  else {
                    pGVar4 = Gia_ObjFanin1(pObjRo);
                    pObjRo->Value = pGVar4->Value;
                  }
                }
                else {
                  pGVar4 = Gia_ObjFanin0(pObjRo);
                  pObjRo->Value = pGVar4->Value;
                }
              }
              else {
                pGVar4 = Gia_ObjFanin0(pObjRo);
                uVar2 = pGVar4->Value;
                pGVar4 = Gia_ObjFanin1(pObjRo);
                uVar2 = Gia_ManHashAnd(p_00,uVar2,pGVar4->Value);
                pObjRo->Value = uVar2;
              }
            }
          }
        }
      }
      Value_1 = Value_1 + 1;
    }
    Value_1 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (Value_1 < iVar1) {
        pObjRo = Gia_ManCo(p,Value_1);
        bVar6 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pGVar4 = Gia_ObjFanin0(pObjRo);
      pObjRo->Value = pGVar4->Value;
      Value_1 = Value_1 + 1;
    }
    if (Value == pCex->iFrame) break;
    Value_1 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar6 = false;
      if (Value_1 < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar1 + Value_1);
        bVar6 = false;
        if (_k != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar1 + Value_1);
          bVar6 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar6) break;
      pObjRi->Value = _k->Value;
      Value_1 = Value_1 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  pGVar4 = Gia_ManPo(p,pCex->iPo);
  iVar1 = Gia_ManGetTwo(p,pCex->iFrame,pGVar4);
  if (iVar1 >> 1 == 0) {
    __assert_fail("(Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x128,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  if (pGVar4->Value == 0) {
    __assert_fail("pObj->Value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x129,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  Gia_ManAppendCo(p_00,pGVar4->Value);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManCreateUnate( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrame, int nRealPis, int fUseAllObjects )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, k, Value;
    assert( iFrame >= 0 && iFrame <= pCex->iFrame );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    Gia_ManCleanValue( p );
    // set flop outputs
    if ( nRealPis < 0 ) // CEX min
    {
        Gia_ManForEachRo( p, pObj, k )
        {
            if ( fUseAllObjects )
            {
                int Value = Gia_ManAppendCi(pNew);
                if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                    pObj->Value = Value;
            }
            else if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                pObj->Value = Gia_ManAppendCi(pNew);
        }
    }
    else
    {
        Gia_ManForEachRo( p, pObj, k )
            pObj->Value = (Gia_ManGetTwo(p, iFrame, pObj) >> 1);
    }
    Gia_ManHashAlloc( pNew );
    for ( f = iFrame; f <= pCex->iFrame; f++ )
    {
/*
        printf( "  F%03d ", f );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->Value > 0 );
        printf( "\n" );
*/
        // set const0 to const1 if present
        pObj = Gia_ManConst0(p);
        pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        // set primary inputs 
        if ( nRealPis < 0 ) // CEX min
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        }
        else
        {
            Gia_ManForEachPi( p, pObj, k )
            {
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
                if ( k >= nRealPis )
                {
                    if ( fUseAllObjects )
                    {
                        int Value = Gia_ManAppendCi(pNew);
                        if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                            pObj->Value = Value;
                    }
                    else if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                        pObj->Value = Gia_ManAppendCi(pNew);
                }
            }
        }
        // traverse internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        { 
            pObj->Value = 0;
            Value = Gia_ManGetTwo(p, f, pObj);
            if ( !(Value >> 1) ) // not in the path
                continue;
            if ( Gia_ObjFanin0(pObj)->Value && Gia_ObjFanin1(pObj)->Value )
            {
                if ( 1 & Gia_ManGetTwo(p, f, pObj) ) // value 1
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
                else // value 0
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
            }
            else if ( Gia_ObjFanin0(pObj)->Value )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( Gia_ObjFanin1(pObj)->Value )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
    }
    Gia_ManHashStop( pNew );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( (Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1) );
    assert( pObj->Value );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}